

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cshutdn.c
# Opt level: O0

_Bool cshutdn_destroy_oldest(cshutdn *cshutdn,Curl_easy *data,char *destination)

{
  int iVar1;
  undefined1 local_d8 [8];
  sigpipe_ignore pipe_st;
  connectdata *conn;
  Curl_llist_node *e;
  char *destination_local;
  Curl_easy *data_local;
  cshutdn *cshutdn_local;
  
  conn = (connectdata *)Curl_llist_head(&cshutdn->list);
  while (((conn != (connectdata *)0x0 &&
          (pipe_st._152_8_ = Curl_node_elem(&conn->cpool_node), destination != (char *)0x0)) &&
         (iVar1 = strcmp(destination,*(char **)(pipe_st._152_8_ + 0x58)), iVar1 != 0))) {
    conn = (connectdata *)Curl_node_next(&conn->cpool_node);
  }
  if (conn != (connectdata *)0x0) {
    pipe_st._152_8_ = Curl_node_elem(&conn->cpool_node);
    Curl_node_remove(&conn->cpool_node);
    sigpipe_init((sigpipe_ignore *)local_d8);
    sigpipe_apply(data,(sigpipe_ignore *)local_d8);
    Curl_cshutdn_terminate(data,(connectdata *)pipe_st._152_8_,false);
    sigpipe_restore((sigpipe_ignore *)local_d8);
  }
  return conn != (connectdata *)0x0;
}

Assistant:

static bool cshutdn_destroy_oldest(struct cshutdn *cshutdn,
                                   struct Curl_easy *data,
                                   const char *destination)
{
  struct Curl_llist_node *e;
  struct connectdata *conn;

  e = Curl_llist_head(&cshutdn->list);
  while(e) {
    conn = Curl_node_elem(e);
    if(!destination || !strcmp(destination, conn->destination))
      break;
    e = Curl_node_next(e);
  }

  if(e) {
    SIGPIPE_VARIABLE(pipe_st);
    conn = Curl_node_elem(e);
    Curl_node_remove(e);
    sigpipe_init(&pipe_st);
    sigpipe_apply(data, &pipe_st);
    Curl_cshutdn_terminate(data, conn, FALSE);
    sigpipe_restore(&pipe_st);
    return TRUE;
  }
  return FALSE;
}